

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_process_scalar(yaml_emitter_t *emitter)

{
  yaml_emitter_t *emitter_local;
  
  switch((emitter->scalar_data).style) {
  case YAML_PLAIN_SCALAR_STYLE:
    emitter_local._4_4_ =
         yaml_emitter_write_plain_scalar
                   (emitter,(emitter->scalar_data).value,(emitter->scalar_data).length,
                    (uint)((emitter->simple_key_context != 0 ^ 0xffU) & 1));
    break;
  case YAML_SINGLE_QUOTED_SCALAR_STYLE:
    emitter_local._4_4_ =
         yaml_emitter_write_single_quoted_scalar
                   (emitter,(emitter->scalar_data).value,(emitter->scalar_data).length,
                    (uint)((emitter->simple_key_context != 0 ^ 0xffU) & 1));
    break;
  case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
    emitter_local._4_4_ =
         yaml_emitter_write_double_quoted_scalar
                   (emitter,(emitter->scalar_data).value,(emitter->scalar_data).length,
                    (uint)((emitter->simple_key_context != 0 ^ 0xffU) & 1));
    break;
  case YAML_LITERAL_SCALAR_STYLE:
    emitter_local._4_4_ =
         yaml_emitter_write_literal_scalar
                   (emitter,(emitter->scalar_data).value,(emitter->scalar_data).length);
    break;
  case YAML_FOLDED_SCALAR_STYLE:
    emitter_local._4_4_ =
         yaml_emitter_write_folded_scalar
                   (emitter,(emitter->scalar_data).value,(emitter->scalar_data).length);
    break;
  default:
    emitter_local._4_4_ = 0;
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_process_scalar(yaml_emitter_t *emitter)
{
    switch (emitter->scalar_data.style)
    {
        case YAML_PLAIN_SCALAR_STYLE:
            return yaml_emitter_write_plain_scalar(emitter,
                    emitter->scalar_data.value, emitter->scalar_data.length,
                    !emitter->simple_key_context);

        case YAML_SINGLE_QUOTED_SCALAR_STYLE:
            return yaml_emitter_write_single_quoted_scalar(emitter,
                    emitter->scalar_data.value, emitter->scalar_data.length,
                    !emitter->simple_key_context);

        case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
            return yaml_emitter_write_double_quoted_scalar(emitter,
                    emitter->scalar_data.value, emitter->scalar_data.length,
                    !emitter->simple_key_context);

        case YAML_LITERAL_SCALAR_STYLE:
            return yaml_emitter_write_literal_scalar(emitter,
                    emitter->scalar_data.value, emitter->scalar_data.length);

        case YAML_FOLDED_SCALAR_STYLE:
            return yaml_emitter_write_folded_scalar(emitter,
                    emitter->scalar_data.value, emitter->scalar_data.length);

        default:
            assert(1);      /* Impossible. */
    }

    return 0;
}